

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.h
# Opt level: O2

void __thiscall Regex::Element::insertChild(Element *this,Element *e)

{
  Element *pEVar1;
  Element *pEVar2;
  Element **ppEVar3;
  
  e->mParent = this;
  e->mNext = (Element *)0x0;
  pEVar1 = this->mChild;
  if (this->mChild == (Element *)0x0) {
    ppEVar3 = &this->mChild;
  }
  else {
    do {
      pEVar2 = pEVar1;
      pEVar1 = pEVar2->mNext;
    } while (pEVar1 != (Element *)0x0);
    ppEVar3 = &pEVar2->mNext;
  }
  *ppEVar3 = e;
  return;
}

Assistant:

void insertChild( Element *e )
		{
			e->mParent = this;
			e->mNext = NULL;
			if ( mChild != NULL )
			{
				Element *c = mChild;
				while( c->mNext != NULL )
					c = c->mNext;
			
				c->mNext = e;
			}
			else
				mChild = e;
		}